

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopenglpaintengine.cpp
# Opt level: O3

bool __thiscall QOpenGL2PaintEngineEx::end(QOpenGL2PaintEngineEx *this)

{
  QOpenGL2PaintEngineExPrivate *this_00;
  Data *pDVar1;
  QOpenGLEngineShaderManager *this_01;
  undefined8 uVar2;
  QObject *pQVar3;
  long in_FS_OFFSET;
  undefined8 local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QOpenGL2PaintEngineExPrivate **)&this->field_0x18;
  (*((this_00->device->d_ptr).d)->_vptr_QOpenGLPaintDevicePrivate[3])();
  pDVar1 = (this_00->ctx).wp.d;
  if ((pDVar1 == (Data *)0x0) || (*(int *)(pDVar1 + 4) == 0)) {
    pQVar3 = (QObject *)0x0;
  }
  else {
    pQVar3 = (this_00->ctx).wp.value;
  }
  (**(code **)(*(long *)&this_00->funcs + 0x418))(0);
  if (this_00->mode != BrushDrawingMode) {
    this_01 = this_00->shaderManager;
    this_01->shaderProgNeedsChanging = true;
    this_01->complexGeometry = false;
    QOpenGLEngineShaderManager::setMaskType((QOpenGLEngineShaderManager *)this_01,NoMask);
    this_00->mode = BrushDrawingMode;
  }
  *(undefined8 *)(*(long *)(pQVar3 + 8) + 0x100) = 0;
  QOpenGL2PaintEngineExPrivate::resetGLState(this_00);
  if (this_00->shaderManager != (QOpenGLEngineShaderManager *)0x0) {
    (**(code **)(*(long *)this_00->shaderManager + 0x20))();
  }
  this_00->shaderManager = (QOpenGLEngineShaderManager *)0x0;
  QBrush::QBrush((QBrush *)&local_20);
  uVar2 = *(undefined8 *)&this_00->currentBrush;
  *(undefined8 *)&this_00->currentBrush = local_20;
  local_20 = uVar2;
  QBrush::~QBrush((QBrush *)&local_20);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return false;
  }
  __stack_chk_fail();
}

Assistant:

bool QOpenGL2PaintEngineEx::end()
{
    Q_D(QOpenGL2PaintEngineEx);

    QOpenGLPaintDevicePrivate::get(d->device)->endPaint();

    QOpenGLContext *ctx = d->ctx;
    d->funcs.glUseProgram(0);
    d->transferMode(BrushDrawingMode);

    ctx->d_func()->active_engine = nullptr;

    d->resetGLState();

    delete d->shaderManager;
    d->shaderManager = nullptr;
    d->currentBrush = QBrush();

#ifdef QT_OPENGL_CACHE_AS_VBOS
    if (!d->unusedVBOSToClean.isEmpty()) {
        glDeleteBuffers(d->unusedVBOSToClean.size(), d->unusedVBOSToClean.constData());
        d->unusedVBOSToClean.clear();
    }
    if (!d->unusedIBOSToClean.isEmpty()) {
        glDeleteBuffers(d->unusedIBOSToClean.size(), d->unusedIBOSToClean.constData());
        d->unusedIBOSToClean.clear();
    }
#endif

    return false;
}